

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void __thiscall
cali::Caliper::push_snapshot(Caliper *this,ChannelBody *chB,SnapshotView trigger_info)

{
  SnapshotBuilder *rec;
  size_t *psVar1;
  int iVar2;
  ThreadData *pTVar3;
  ThreadData *pTVar4;
  GlobalData *pGVar5;
  ThreadData *pTVar6;
  size_t sVar7;
  pointer pfVar8;
  Entry *pEVar9;
  SnapshotView __args_1;
  ChannelBody *pCVar10;
  int iVar11;
  unsigned_long __n2_1;
  ulong uVar12;
  unsigned_long __n2;
  ulong uVar13;
  size_t sVar14;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)> *f;
  pointer this_00;
  SnapshotView __args_2;
  SnapshotView local_58;
  pthread_mutex_t *local_48;
  ChannelBody *local_40;
  Caliper *local_38;
  
  local_58.m_len = trigger_info.m_len;
  local_58.m_data = trigger_info.m_data;
  pTVar3 = this->sT;
  (pTVar3->lock).m_lock = (pTVar3->lock).m_lock + 1;
  (pTVar3->snapshot).m_builder.m_data = (pTVar3->snapshot).m_data;
  (pTVar3->snapshot).m_builder.m_capacity = 0x78;
  (pTVar3->snapshot).m_builder.m_len = 0;
  (pTVar3->snapshot).m_builder.m_skipped = 0;
  pTVar4 = this->sT;
  rec = &(pTVar4->snapshot).m_builder;
  local_40 = chB;
  Blackboard::snapshot(&pTVar4->thread_blackboard,rec);
  pGVar5 = this->sG;
  pTVar6 = this->sT;
  iVar2 = (pGVar5->process_blackboard).ucount.super___atomic_base<int>._M_i;
  if (pTVar6->process_bb_count < iVar2) {
    local_48 = (pthread_mutex_t *)&pGVar5->process_blackboard_lock;
    (pTVar6->process_snapshot).m_builder.m_data = (pTVar6->process_snapshot).m_data;
    (pTVar6->process_snapshot).m_builder.m_capacity = 0x78;
    (pTVar6->process_snapshot).m_builder.m_len = 0;
    (pTVar6->process_snapshot).m_builder.m_skipped = 0;
    iVar11 = pthread_mutex_lock(local_48);
    if (iVar11 != 0) {
      std::__throw_system_error(iVar11);
    }
    Blackboard::snapshot(&pGVar5->process_blackboard,&(pTVar6->process_snapshot).m_builder);
    pTVar6->process_bb_count = iVar2;
    pthread_mutex_unlock(local_48);
  }
  uVar12 = (this->sT->process_snapshot).m_builder.m_len;
  sVar7 = (pTVar4->snapshot).m_builder.m_len;
  uVar13 = (pTVar4->snapshot).m_builder.m_capacity - sVar7;
  if (uVar12 <= uVar13) {
    uVar13 = uVar12;
  }
  if (uVar13 != 0) {
    memmove(rec->m_data + sVar7,(this->sT->process_snapshot).m_builder.m_data,uVar13 * 0x18);
  }
  sVar7 = local_58.m_len;
  sVar14 = uVar13 + (pTVar4->snapshot).m_builder.m_len;
  (pTVar4->snapshot).m_builder.m_len = sVar14;
  psVar1 = &(pTVar4->snapshot).m_builder.m_skipped;
  *psVar1 = *psVar1 + (uVar12 - uVar13);
  uVar12 = (pTVar4->snapshot).m_builder.m_capacity - sVar14;
  if (local_58.m_len <= uVar12) {
    uVar12 = local_58.m_len;
  }
  if (uVar12 != 0) {
    memmove(rec->m_data + sVar14,local_58.m_data,uVar12 * 0x18);
  }
  pCVar10 = local_40;
  psVar1 = &(pTVar4->snapshot).m_builder.m_len;
  *psVar1 = *psVar1 + uVar12;
  psVar1 = &(pTVar4->snapshot).m_builder.m_skipped;
  *psVar1 = *psVar1 + (sVar7 - uVar12);
  local_38 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(local_40->events).snapshot,&local_38,&local_58,rec);
  this_00 = (pCVar10->events).process_snapshot.mCb.
            super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pfVar8 = (pCVar10->events).process_snapshot.mCb.
           super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pfVar8) {
    pEVar9 = (pTVar4->snapshot).m_builder.m_data;
    sVar7 = (pTVar4->snapshot).m_builder.m_len;
    do {
      __args_1.m_len = local_58.m_len;
      __args_1.m_data = local_58.m_data;
      __args_2.m_len = sVar7;
      __args_2.m_data = pEVar9;
      std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::operator()
                (this_00,this,__args_1,__args_2);
      this_00 = this_00 + 1;
    } while (this_00 != pfVar8);
  }
  (pTVar3->lock).m_lock = (pTVar3->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::push_snapshot(ChannelBody* chB, SnapshotView trigger_info)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}